

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::ParseTextureChunk(Discreet3DSImporter *this,Texture *pcOut)

{
  StreamReader<false,_false> *this_00;
  int8_t *piVar1;
  char cVar2;
  ushort uVar3;
  uint _limit;
  Logger *pLVar4;
  ulong uVar5;
  float fVar6;
  ai_real aVar7;
  double dVar8;
  Chunk chunk;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&chunk);
    } while ((int)(chunk.Size - 6) < 1);
    this_00 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_00,(chunk.Size - 6) +
                                (*(int *)&this_00->current - *(int *)&this_00->buffer));
    switch(chunk.Flag) {
    case 0xa351:
      uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
      if ((uVar3 & 2) == 0) {
        if ((uVar3 & 0x10) == 0) {
          pcOut->mMapMode = aiTextureMapMode_Wrap;
        }
        else {
          pcOut->mMapMode = aiTextureMapMode_Decal;
        }
      }
      else {
        pcOut->mMapMode = aiTextureMapMode_Mirror;
      }
      break;
    case 0xa352:
    case 0xa353:
    case 0xa355:
    case 0xa357:
    case 0xa359:
    case 0xa35b:
      break;
    case 0xa354:
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      pcOut->mScaleU = fVar6;
      if ((fVar6 == 0.0) && (!NAN(fVar6))) {
        pLVar4 = DefaultLogger::get();
        Logger::warn(pLVar4,"Texture coordinate scaling in the x direction is zero. Assuming 1.");
        pcOut->mScaleU = 1.0;
      }
      break;
    case 0xa356:
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      pcOut->mScaleV = fVar6;
      if ((fVar6 == 0.0) && (!NAN(fVar6))) {
        pLVar4 = DefaultLogger::get();
        Logger::warn(pLVar4,"Texture coordinate scaling in the y direction is zero. Assuming 1.");
        pcOut->mScaleV = 1.0;
      }
      break;
    case 0xa358:
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      pcOut->mOffsetU = -fVar6;
      break;
    case 0xa35a:
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      pcOut->mOffsetV = fVar6;
      break;
    case 0xa35c:
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      pcOut->mRotation = fVar6 * -0.017453292;
      break;
    default:
      if (chunk.Flag == 0x30) {
        uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
        aVar7 = (float)uVar3 / 100.0;
      }
      else if (chunk.Flag == 0x31) {
        aVar7 = StreamReader<false,_false>::Get<float>(this->stream);
      }
      else {
        if (chunk.Flag != 0x32) {
          if (chunk.Flag == 0xa300) {
            piVar1 = this->stream->current;
            uVar5 = 0xffffffffffffffff;
            do {
              cVar2 = StreamReader<false,_false>::Get<signed_char>(this->stream);
              uVar5 = (ulong)((int)uVar5 + 1);
            } while (cVar2 != '\0');
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,piVar1,piVar1 + uVar5);
            std::__cxx11::string::operator=((string *)&pcOut->mMapName,(string *)local_50);
            std::__cxx11::string::~string((string *)local_50);
          }
          break;
        }
        dVar8 = StreamReader<false,_false>::Get<double>(this->stream);
        aVar7 = (ai_real)dVar8;
      }
      pcOut->mTextureBlend = aVar7;
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
    if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseTextureChunk(D3DS::Texture* pcOut)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_MAPFILE:
        {
        // The material name string is already zero-terminated, but we need to be sure ...
        const char* sz = (const char*)stream->GetPtr();
        unsigned int cnt = 0;
        while (stream->GetI1())
            ++cnt;
        pcOut->mMapName = std::string(sz,cnt);
        }
        break;


    case Discreet3DS::CHUNK_PERCENTD:
        // Manually parse the blend factor
        pcOut->mTextureBlend = ai_real( stream->GetF8() );
        break;

    case Discreet3DS::CHUNK_PERCENTF:
        // Manually parse the blend factor
        pcOut->mTextureBlend = stream->GetF4();
        break;

    case Discreet3DS::CHUNK_PERCENTW:
        // Manually parse the blend factor
        pcOut->mTextureBlend = (ai_real)((uint16_t)stream->GetI2()) / ai_real( 100.0 );
        break;

    case Discreet3DS::CHUNK_MAT_MAP_USCALE:
        // Texture coordinate scaling in the U direction
        pcOut->mScaleU = stream->GetF4();
        if (0.0f == pcOut->mScaleU)
        {
            ASSIMP_LOG_WARN("Texture coordinate scaling in the x direction is zero. Assuming 1.");
            pcOut->mScaleU = 1.0f;
        }
        break;
    case Discreet3DS::CHUNK_MAT_MAP_VSCALE:
        // Texture coordinate scaling in the V direction
        pcOut->mScaleV = stream->GetF4();
        if (0.0f == pcOut->mScaleV)
        {
            ASSIMP_LOG_WARN("Texture coordinate scaling in the y direction is zero. Assuming 1.");
            pcOut->mScaleV = 1.0f;
        }
        break;

    case Discreet3DS::CHUNK_MAT_MAP_UOFFSET:
        // Texture coordinate offset in the U direction
        pcOut->mOffsetU = -stream->GetF4();
        break;

    case Discreet3DS::CHUNK_MAT_MAP_VOFFSET:
        // Texture coordinate offset in the V direction
        pcOut->mOffsetV = stream->GetF4();
        break;

    case Discreet3DS::CHUNK_MAT_MAP_ANG:
        // Texture coordinate rotation, CCW in DEGREES
        pcOut->mRotation = -AI_DEG_TO_RAD( stream->GetF4() );
        break;

    case Discreet3DS::CHUNK_MAT_MAP_TILING:
        {
        const uint16_t iFlags = stream->GetI2();

        // Get the mapping mode (for both axes)
        if (iFlags & 0x2u)
            pcOut->mMapMode = aiTextureMapMode_Mirror;

        else if (iFlags & 0x10u)
            pcOut->mMapMode = aiTextureMapMode_Decal;

        // wrapping in all remaining cases
        else pcOut->mMapMode = aiTextureMapMode_Wrap;
        }
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}